

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

void Ssc_GiaClassesInit(Gia_Man_t *p)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar4;
  int iVar5;
  int v;
  Gia_Man_t *pGVar6;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                  ,0x10d,"void Ssc_GiaClassesInit(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  pGVar6 = (Gia_Man_t *)(long)iVar1;
  pGVar2 = (Gia_Rpr_t *)calloc((size_t)pGVar6,4);
  p->pReprs = pGVar2;
  piVar3 = (int *)calloc((size_t)pGVar6,4);
  p->pNexts = piVar3;
  for (v = 0; iVar5 = (int)pGVar6, v < iVar1; v = v + 1) {
    pGVar6 = p;
    pObj = Gia_ManObj(p,v);
    iVar5 = (int)pGVar6;
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsCand(pObj);
    iVar5 = 0;
    if (iVar1 == 0) {
      iVar5 = 0xfffffff;
    }
    pGVar6 = p;
    Gia_ObjSetRepr(p,v,iVar5);
    iVar1 = p->nObjs;
  }
  if (p->vClassOld == (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntAlloc(iVar5);
    p->vClassOld = pVVar4;
  }
  if (p->vClassNew == (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntAlloc(iVar5);
    p->vClassNew = pVVar4;
  }
  return;
}

Assistant:

void Ssc_GiaClassesInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjSetRepr( p, i, Gia_ObjIsCand(pObj) ? 0 : GIA_VOID );
    if ( p->vClassOld == NULL )
        p->vClassOld = Vec_IntAlloc( 100 );
    if ( p->vClassNew == NULL )
        p->vClassNew = Vec_IntAlloc( 100 );
}